

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm_lib.c
# Opt level: O0

void libdef_name(char *p,int kind)

{
  uint8_t *puVar1;
  int iVar2;
  int in_ESI;
  char *in_RDI;
  size_t n;
  ulong local_18;
  char *local_8;
  
  local_18 = strlen(in_RDI);
  local_8 = in_RDI;
  if ((((in_ESI != 0xc0) && (modnamelen < local_18)) && (in_RDI[modnamelen] == '_')) &&
     (iVar2 = strncmp(in_RDI,modname,modnamelen), iVar2 == 0)) {
    local_8 = in_RDI + modnamelen + 1;
    local_18 = local_18 - (modnamelen + 1);
  }
  if (local_18 < 0x39) {
    if (optr + local_18 + 3 <= &optr) {
      puVar1 = optr + 1;
      *optr = (byte)local_18 | (byte)in_ESI;
      optr = puVar1;
      memcpy(optr,local_8,local_18);
      optr = optr + local_18;
      return;
    }
    fprintf(_stderr,"Error: output buffer overflow\n");
    exit(1);
  }
  fprintf(_stderr,"Error: string too long: \'%s\'\n",local_8);
  exit(1);
}

Assistant:

static void libdef_name(const char *p, int kind)
{
  size_t n = strlen(p);
  if (kind != LIBINIT_STRING) {
    if (n > modnamelen && p[modnamelen] == '_' &&
	!strncmp(p, modname, modnamelen)) {
      p += modnamelen+1;
      n -= modnamelen+1;
    }
  }
  if (n > LIBINIT_MAXSTR) {
    fprintf(stderr, "Error: string too long: '%s'\n",  p);
    exit(1);
  }
  if (optr+1+n+2 > obuf+sizeof(obuf)) {  /* +2 for caller. */
    fprintf(stderr, "Error: output buffer overflow\n");
    exit(1);
  }
  *optr++ = (uint8_t)(n | kind);
  memcpy(optr, p, n);
  optr += n;
}